

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O2

string * __thiscall
ZXing::OneD::DataBar::DecodeAI013x0x1x_abi_cxx11_
          (string *__return_storage_ptr__,DataBar *this,BitArrayView *bits,char *aiPrefix,
          char *dateCode)

{
  int iVar1;
  int iVar2;
  int len;
  string sStack_48;
  
  DecodeAI01GTIN_abi_cxx11_(__return_storage_ptr__,this,bits);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  iVar1 = BitArrayView::readBits((BitArrayView *)this,0x14);
  iVar2 = 100000;
  std::__cxx11::to_string(&sStack_48,iVar1 / 100000);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_48);
  ToString<int,void>(&sStack_48,(ZXing *)((long)iVar1 % 100000 & 0xffffffff),6,iVar2);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_48);
  iVar1 = BitArrayView::readBits((BitArrayView *)this,0x10);
  if (iVar1 != 0x9600) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar2 = (int)((long)iVar1 / 0x20);
    len = 0x180;
    ToString<int,void>(&sStack_48,(ZXing *)((long)iVar1 / 0x180 & 0xffffffff),2,0x180);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    ToString<int,void>(&sStack_48,
                       (ZXing *)(ulong)((int)((long)((ulong)(uint)(iVar2 >> 0x1f) << 0x20 |
                                                    (long)iVar1 / 0x20 & 0xffffffffU) % 0xc) + 1),2,
                       len);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    ToString<int,void>(&sStack_48,(ZXing *)(ulong)(uint)(iVar1 + iVar2 * -0x20),2,len);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string DecodeAI013x0x1x(BitArrayView& bits, const char* aiPrefix, const char* dateCode)
{
	std::string buffer = DecodeAI01GTIN(bits);
	buffer.append(aiPrefix);

	int weight = bits.readBits(20);
	buffer.append(std::to_string(weight / 100000));
	buffer.append(ToString(weight % 100000, 6));

	int date = bits.readBits(16);
	if (date != 38400) {
		buffer.append(dateCode);

		int day = date % 32;
		date /= 32;
		int month = date % 12 + 1;
		date /= 12;
		int year = date;

		buffer.append(ToString(year, 2));
		buffer.append(ToString(month, 2));
		buffer.append(ToString(day, 2));
	}

	return buffer;
}